

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Expr * __thiscall parser::Parser::parseBoolean(Parser *this)

{
  TokenType TVar1;
  BooleanExpr *this_00;
  Token *this_01;
  Token local_80;
  Token local_50;
  
  TVar1 = (this->curToken).Type;
  this_00 = (BooleanExpr *)operator_new(0x48);
  if (TVar1 == TRUE) {
    this_01 = &local_50;
    token::Token::Token(this_01,&this->curToken);
    ast::BooleanExpr::BooleanExpr(this_00,this_01,true,this->l->line);
  }
  else {
    this_01 = &local_80;
    token::Token::Token(this_01,&this->curToken);
    ast::BooleanExpr::BooleanExpr(this_00,this_01,false,this->l->line);
  }
  token::Token::~Token(this_01);
  return &this_00->super_Expr;
}

Assistant:

Expr* Parser::parseBoolean()
{
    if(curTokenIs(TokenType::TRUE))
        return new BooleanExpr(curToken, true, l->line);
    return new BooleanExpr(curToken, false, l->line);
}